

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

int session_get_handle_max(SESSION_HANDLE session,handle *handle_max)

{
  int iVar1;
  
  iVar1 = 0x43a;
  if (handle_max != (handle *)0x0 && session != (SESSION_HANDLE)0x0) {
    *handle_max = session->handle_max;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int session_get_handle_max(SESSION_HANDLE session, handle* handle_max)
{
    int result;

    if ((session == NULL) ||
        (handle_max == NULL))
    {
        result = MU_FAILURE;
    }
    else
    {
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)session;

        *handle_max = session_instance->handle_max;

        result = 0;
    }

    return result;
}